

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2PaddedCell *parent,int i,int j)

{
  int position;
  int iVar1;
  S2CellId SVar2;
  R2Rect *this_00;
  R1Interval *pRVar3;
  double *pdVar4;
  double dVar5;
  R2Rect *middle;
  int ij_size;
  int pos;
  int j_local;
  int i_local;
  S2PaddedCell *parent_local;
  S2PaddedCell *this_local;
  
  S2CellId::S2CellId(&this->id_);
  this->padding_ = parent->padding_;
  (this->bound_).bounds_[0].bounds_.c_[0] = (parent->bound_).bounds_[0].bounds_.c_[0];
  (this->bound_).bounds_[0].bounds_.c_[1] = (parent->bound_).bounds_[0].bounds_.c_[1];
  (this->bound_).bounds_[1].bounds_.c_[0] = (parent->bound_).bounds_[1].bounds_.c_[0];
  (this->bound_).bounds_[1].bounds_.c_[1] = (parent->bound_).bounds_[1].bounds_.c_[1];
  R2Rect::R2Rect(&this->middle_);
  this->level_ = parent->level_ + 1;
  position = *(int *)(S2::internal::kIJtoPos +
                     (long)(i * 2 + j) * 4 + (long)parent->orientation_ * 0x10);
  SVar2 = S2CellId::child(&parent->id_,position);
  (this->id_).id_ = SVar2.id_;
  iVar1 = S2CellId::GetSizeIJ(this->level_);
  this->ij_lo_[0] = parent->ij_lo_[0] + i * iVar1;
  this->ij_lo_[1] = parent->ij_lo_[1] + j * iVar1;
  this->orientation_ = parent->orientation_ ^ (&S2::internal::kPosToOrientation)[position];
  this_00 = S2PaddedCell::middle(parent);
  pRVar3 = R2Rect::operator[](this_00,0);
  dVar5 = R1Interval::operator[](pRVar3,1 - i);
  pRVar3 = R2Rect::operator[](&this->bound_,0);
  pdVar4 = R1Interval::operator[](pRVar3,1 - i);
  *pdVar4 = dVar5;
  pRVar3 = R2Rect::operator[](this_00,1);
  dVar5 = R1Interval::operator[](pRVar3,1 - j);
  pRVar3 = R2Rect::operator[](&this->bound_,1);
  pdVar4 = R1Interval::operator[](pRVar3,1 - j);
  *pdVar4 = dVar5;
  return;
}

Assistant:

S2PaddedCell::S2PaddedCell(const S2PaddedCell& parent, int i, int j)
    : padding_(parent.padding_),
      bound_(parent.bound_),
      level_(parent.level_ + 1) {
  // Compute the position and orientation of the child incrementally from the
  // orientation of the parent.
  int pos = kIJtoPos[parent.orientation_][2*i+j];
  id_ = parent.id_.child(pos);
  int ij_size = S2CellId::GetSizeIJ(level_);
  ij_lo_[0] = parent.ij_lo_[0] + i * ij_size;
  ij_lo_[1] = parent.ij_lo_[1] + j * ij_size;
  orientation_ = parent.orientation_ ^ kPosToOrientation[pos];
  // For each child, one corner of the bound is taken directly from the parent
  // while the diagonally opposite corner is taken from middle().
  const R2Rect& middle = parent.middle();
  bound_[0][1-i] = middle[0][1-i];
  bound_[1][1-j] = middle[1][1-j];
}